

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  CapTableReader *pCVar1;
  long lVar2;
  undefined8 *puVar3;
  Initializer *pIVar4;
  Maybe<capnp::_::RawSchema_*const_&> MVar5;
  RawBrandedSchema *pRVar6;
  long in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_04;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_05;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_06;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar7;
  LazyLoadCallback *c;
  RawSchema *schema;
  Maybe<capnp::Schema> MVar8;
  ListReader local_a0;
  long local_70;
  PointerReader local_68;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  kj::_::Mutex::lock((Mutex *)id,SHARED);
  pCVar1 = (CapTableReader *)(id + 0x18);
  lVar2 = *(long *)(id + 0x20);
  local_a0.segment = (SegmentReader *)id;
  local_a0.capTable = pCVar1;
  local_68.segment = (SegmentReader *)scope.raw;
  MVar5 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)(lVar2 + 0x68),
                     (unsigned_long *)&local_68);
  if (MVar5.ptr == (RawSchema **)0x0) {
    schema = (RawSchema *)0x0;
  }
  else {
    schema = *MVar5.ptr;
  }
  puVar3 = *(undefined8 **)(lVar2 + 0x198);
  aVar7 = extraout_RDX;
  local_70 = in_RCX;
  if (local_a0.segment != (SegmentReader *)0x0) {
    kj::_::Mutex::unlock((Mutex *)local_a0.segment,SHARED);
    aVar7 = extraout_RDX_00;
  }
  if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
    if (puVar3 != (undefined8 *)0x0) {
      (**(code **)*puVar3)(puVar3,id,scope.raw);
    }
    kj::_::Mutex::lock((Mutex *)id,SHARED);
    local_a0.segment = (SegmentReader *)id;
    local_a0.capTable = pCVar1;
    local_68.segment = (SegmentReader *)scope.raw;
    MVar5 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                      ((HashMap<unsigned_long,capnp::_::RawSchema*> *)(*(long *)(id + 0x20) + 0x68),
                       (unsigned_long *)&local_68);
    if (MVar5.ptr == (RawSchema **)0x0) {
      schema = (RawSchema *)0x0;
    }
    else {
      schema = *MVar5.ptr;
    }
    aVar7 = extraout_RDX_01;
    if (local_a0.segment != (SegmentReader *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_a0.segment,SHARED);
      aVar7 = extraout_RDX_02;
    }
  }
  if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
    *(undefined1 *)&(this->impl).mutex.futex = 0;
  }
  else {
    local_68.capTable = brand._reader.capTable;
    local_68.pointer = brand._reader.pointers;
    local_68.segment = brand._reader.segment;
    local_68.nestingLimit = brand._reader.nestingLimit;
    if (brand._reader.pointerCount == 0) {
      local_68.capTable = (CapTableReader *)0x0;
      local_68.pointer = (WirePointer *)0x0;
      local_68.segment = (SegmentReader *)0x0;
      local_68.nestingLimit = 0x7fffffff;
    }
    _::PointerReader::getList(&local_a0,&local_68,INLINE_COMPOSITE,(word *)0x0);
    if (local_a0.elementCount == 0) {
      *(undefined1 *)&(this->impl).mutex.futex = 1;
      (this->impl).mutex.waitersHead.ptr = (Waiter *)&schema->defaultBrand;
      aVar7 = extraout_RDX_03;
    }
    else {
      kj::_::Mutex::lock((Mutex *)id,EXCLUSIVE);
      local_48.ptr.field_1.value.ptr = (Scope *)*(undefined8 *)(local_70 + 8);
      local_48.ptr.field_1.value.size_ = (size_t)*(uint *)(local_70 + 0x18);
      local_48.ptr.isSet = true;
      local_a0.segment = (SegmentReader *)id;
      local_a0.capTable = pCVar1;
      pRVar6 = Impl::makeBranded(*(Impl **)(id + 0x20),schema,brand,&local_48);
      aVar7 = extraout_RDX_04;
      if (local_a0.segment != (SegmentReader *)0x0) {
        kj::_::Mutex::unlock((Mutex *)local_a0.segment,EXCLUSIVE);
        aVar7 = extraout_RDX_05;
      }
      pIVar4 = pRVar6->lazyInitializer;
      if (pIVar4 != (Initializer *)0x0) {
        (**pIVar4->_vptr_Initializer)(pIVar4,pRVar6);
        aVar7 = extraout_RDX_06;
      }
      *(undefined1 *)&(this->impl).mutex.futex = 1;
      (this->impl).mutex.waitersHead.ptr = (Waiter *)pRVar6;
    }
  }
  MVar8.ptr.field_1 = aVar7;
  MVar8.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar8.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_MAYBE(c, getResult.callback) {
      c->load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand, kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return nullptr;
  }
}